

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

void __thiscall
QTreeView::dataChanged
          (QTreeView *this,QModelIndex *topLeft,QModelIndex *bottomRight,QList<int> *roles)

{
  QTreeViewPrivate *this_00;
  bool bVar1;
  int item;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer pQVar5;
  long lVar6;
  bool bVar7;
  
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  if ((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout != false) {
    return;
  }
  item = QTreeViewPrivate::viewIndex(this_00,topLeft);
  if (item == 0) {
    iVar2 = indexRowSizeHint(this,topLeft);
    bVar7 = this_00->defaultItemHeight != iVar2;
    this_00->defaultItemHeight = iVar2;
  }
  else {
    bVar7 = false;
  }
  if (item != -1) {
    if (topLeft->r == bottomRight->r) {
      iVar2 = QTreeViewPrivate::itemHeight(this_00,item);
      pQVar5 = QList<QTreeViewItem>::data(&this_00->viewItems);
      *(undefined2 *)&pQVar5[item].field_0x22 = 0;
      iVar3 = QTreeViewPrivate::itemHeight(this_00,item);
      bVar7 = (bool)(bVar7 | iVar2 != iVar3);
      if (topLeft->c == 0) {
        bVar1 = QTreeViewPrivate::hasVisibleChildren(this_00,topLeft);
        pQVar5 = QList<QTreeViewItem>::data(&this_00->viewItems);
        *(ulong *)&pQVar5[item].field_0x1c =
             (*(ulong *)&pQVar5[item].field_0x1c & 0xfffffffffffffffb) + (ulong)bVar1 * 4;
      }
    }
    else {
      iVar2 = QTreeViewPrivate::viewIndex(this_00,bottomRight);
      if (item <= iVar2) {
        lVar6 = (long)item * 0x28;
        do {
          iVar3 = QTreeViewPrivate::itemHeight(this_00,item);
          pQVar5 = QList<QTreeViewItem>::data(&this_00->viewItems);
          *(ulong *)(&pQVar5->field_0x1c + lVar6) =
               *(ulong *)(&pQVar5->field_0x1c + lVar6) & 0xffffffffffff;
          iVar4 = QTreeViewPrivate::itemHeight(this_00,item);
          if (topLeft->c == 0) {
            bVar1 = QTreeViewPrivate::hasVisibleChildren
                              (this_00,(QModelIndex *)
                                       ((long)&(((this_00->viewItems).d.ptr)->index).r + lVar6));
            pQVar5 = QList<QTreeViewItem>::data(&this_00->viewItems);
            *(ulong *)(&pQVar5->field_0x1c + lVar6) =
                 (*(ulong *)(&pQVar5->field_0x1c + lVar6) & 0xfffffffffffffffb) + (ulong)bVar1 * 4;
          }
          bVar7 = (bool)(bVar7 | iVar3 != iVar4);
          item = item + 1;
          lVar6 = lVar6 + 0x28;
        } while (iVar2 + 1 != item);
      }
    }
  }
  if (bVar7) {
    QTreeViewPrivate::updateScrollBars(this_00);
    QWidget::update((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                    viewport);
  }
  QAbstractItemView::dataChanged((QAbstractItemView *)this,topLeft,bottomRight,roles);
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }